

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPath.c
# Opt level: O0

void Abc_GraphPathPrint4(int *pBuffer,Vec_Int_t *vEdges)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  int x1;
  int y1;
  int x0;
  int y0;
  int *pNodes;
  int nEdges;
  int e;
  int y;
  int x;
  char Box [13] [13];
  Vec_Int_t *vEdges_local;
  int *pBuffer_local;
  
  unique0x10000214 = vEdges;
  iVar1 = Vec_IntSize(vEdges);
  for (nEdges = 0; nEdges < 0xd; nEdges = nEdges + 1) {
    for (e = 0; e < 0xd; e = e + 1) {
      if ((nEdges % 4 == 0) && (e % 4 == 0)) {
        *(undefined1 *)((long)&y + (long)e + (long)nEdges * 0xd) = 0x2a;
      }
      else {
        *(undefined1 *)((long)&y + (long)e + (long)nEdges * 0xd) = 0x20;
      }
    }
  }
  pNodes._4_4_ = 0;
  do {
    if (iVar1 / 2 <= pNodes._4_4_) {
      nEdges = 0;
      while (nEdges < 0xd) {
        for (e = 0; e < 0xd; e = e + 1) {
          printf("%c",(ulong)(uint)(int)*(char *)((long)&y + (long)e + (long)nEdges * 0xd));
        }
        nEdges = nEdges + 1;
        printf("\n");
      }
      printf("\n\n=================================\n\n");
      return;
    }
    piVar3 = Vec_IntEntryP(stack0xffffffffffffffe8,pNodes._4_4_ << 1);
    nEdges = (*piVar3 / 4) * 4;
    e = (*piVar3 % 4) * 4;
    iVar2 = piVar3[1] / 4 << 2;
    iVar4 = piVar3[1] % 4 << 2;
    if (pBuffer[pNodes._4_4_] != 0) {
      if (nEdges == iVar2) {
        while (e = e + 1, e < iVar4) {
          *(undefined1 *)((long)&y + (long)e + (long)nEdges * 0xd) = 0x2d;
        }
      }
      else {
        if (e != iVar4) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilPath.c"
                        ,0xd2,"void Abc_GraphPathPrint4(int *, Vec_Int_t *)");
        }
        while (nEdges = nEdges + 1, nEdges < iVar2) {
          *(undefined1 *)((long)&y + (long)e + (long)nEdges * 0xd) = 0x7c;
        }
      }
    }
    pNodes._4_4_ = pNodes._4_4_ + 1;
  } while( true );
}

Assistant:

void Abc_GraphPathPrint4( int * pBuffer, Vec_Int_t * vEdges )
{
    char Box[13][13];
    int x, y;
    int e, nEdges = Vec_IntSize(vEdges)/2;
    for ( y = 0; y < 13; y++ )
    for ( x = 0; x < 13; x++ )
        if ( y % 4 == 0 && x % 4 == 0 )
            Box[y][x] = '*';
        else
            Box[y][x] = ' ';
    for ( e = 0; e < nEdges; e++ )
    {
        int * pNodes = Vec_IntEntryP(vEdges, 2*e);
        int y0 = 4*(pNodes[0]/4);
        int x0 = 4*(pNodes[0]%4);
        int y1 = 4*(pNodes[1]/4);
        int x1 = 4*(pNodes[1]%4);
        if ( !pBuffer[e] )
            continue;
        if ( y0 == y1 )
        {
            for ( x = x0+1; x < x1; x++ )
                Box[y0][x] = '-';
        }
        else if ( x0 == x1 )
        {
            for ( y = y0+1; y < y1; y++ )
                Box[y][x0] = '|';
        }
        else assert( 0 );
    }
    for ( y = 0; y < 13; y++, printf("\n") )
    for ( x = 0; x < 13; x++ )
        printf( "%c", Box[y][x] );
    printf( "\n\n=================================\n\n" );
}